

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Value * __thiscall
soul::heart::TypeCast::getAsConstant(Value *__return_storage_ptr__,TypeCast *this)

{
  Value sourceValue;
  Value local_58;
  
  (*(((this->source).object)->super_Object)._vptr_Object[7])(&local_58);
  if (local_58.type.category == invalid) {
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
  }
  else {
    soul::Value::tryCastToType(__return_storage_ptr__,&local_58,&this->destType);
  }
  soul::Value::~Value(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto sourceValue = source->getAsConstant();

            if (sourceValue.isValid())
                return sourceValue.tryCastToType (destType);

            return {};
        }